

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

JsonT<void> * __thiscall rlib::JsonT<void>::operator=(JsonT<void> *this,JsonT<void> *s)

{
  JsonT<void> *this_00;
  JsonT<void> *in_RSI;
  JsonT<void> *in_RDI;
  Map *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  JsonT<void> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  JsonT<void> *local_10;
  
  if (in_RDI != in_RSI) {
    local_10 = in_RSI;
    clear(in_stack_ffffffffffffffb0);
    this_00 = (JsonT<void> *)(ulong)local_10->m_type;
    switch(this_00) {
    case (JsonT<void> *)0x0:
      JsonT(in_RDI,(nullptr_t)0x0);
      break;
    case (JsonT<void> *)0x1:
      JsonT<bool>(in_RDI,(bool)((local_10->field_1).m_bool & 1),(type *)0x0);
      break;
    case (JsonT<void> *)0x2:
      JsonT<double>(in_RDI,(local_10->field_1).m_float,(type *)0x0);
      break;
    case (JsonT<void> *)0x3:
      JsonT<long>(in_RDI,(local_10->field_1).m_int,(type *)0x0);
      break;
    case (JsonT<void> *)0x4:
      s_00 = &local_30;
      std::__cxx11::string::string((string *)s_00,(string *)&(local_10->field_1).m_string);
      JsonT<std::__cxx11::string>(this_00,s_00,(type *)0x16624a);
      std::__cxx11::string::~string((string *)&local_30);
      break;
    case (JsonT<void> *)0x5:
      JsonT(this_00,(Array *)in_stack_ffffffffffffffa8);
      break;
    case (JsonT<void> *)0x6:
      JsonT(this_00,in_stack_ffffffffffffffa8);
    }
  }
  return in_RDI;
}

Assistant:

JsonT& operator=(const JsonT& s) {
			if (this != &s) {
				clear();
				switch (s.m_type) {
				case Type::Null:	new(this) JsonT(nullptr);	break;
				case Type::Bool:	new(this) JsonT(s.m_bool);	break;
				case Type::Float:	new(this) JsonT(s.m_float);	break;
				case Type::Int:		new(this) JsonT(s.m_int);	break;
				case Type::String:	new(this) JsonT(s.m_string); break;
				case Type::Array:	new(this) JsonT(s.m_array);	break;
				case Type::Map:		new(this) JsonT(s.m_map);	break;
				default:		assert(false);
				}
			}
			return *this;
		}